

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_15::BinaryReaderObjdumpPrepass::OnTagSymbol
          (BinaryReaderObjdumpPrepass *this,Index index,uint32_t flags,string_view name,
          Index tag_index)

{
  string_view name_00;
  bool bVar1;
  reference this_00;
  allocator<char> local_79;
  ObjdumpSymbol local_78;
  BinaryReaderObjdumpPrepass *local_48;
  size_t local_40;
  Index local_34;
  uint32_t local_30;
  Index tag_index_local;
  uint32_t flags_local;
  Index index_local;
  BinaryReaderObjdumpPrepass *this_local;
  string_view name_local;
  
  name_local._M_len = (size_t)name._M_str;
  this_local = (BinaryReaderObjdumpPrepass *)name._M_len;
  local_34 = tag_index;
  local_30 = flags;
  tag_index_local = index;
  _flags_local = this;
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  if (!bVar1) {
    local_48 = this_local;
    local_40 = name_local._M_len;
    name_00._M_str = (char *)name_local._M_len;
    name_00._M_len = (size_t)this_local;
    SetTagName(this,local_34,name_00);
  }
  local_78.kind = Tag;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_78.name,
             (basic_string_view<char,_std::char_traits<char>_> *)&this_local,&local_79);
  local_78.index = local_34;
  this_00 = std::vector<wabt::ObjdumpSymbol,_std::allocator<wabt::ObjdumpSymbol>_>::operator[]
                      (&((this->super_BinaryReaderObjdumpBase).objdump_state_)->symtab,
                       (ulong)tag_index_local);
  ObjdumpSymbol::operator=(this_00,&local_78);
  ObjdumpSymbol::~ObjdumpSymbol(&local_78);
  std::allocator<char>::~allocator(&local_79);
  Result::Result((Result *)((long)&name_local._M_str + 4),Ok);
  return (Result)name_local._M_str._4_4_;
}

Assistant:

Result OnTagSymbol(Index index,
                     uint32_t flags,
                     std::string_view name,
                     Index tag_index) override {
    if (!name.empty()) {
      SetTagName(tag_index, name);
    }
    objdump_state_->symtab[index] = {SymbolType::Tag, std::string(name),
                                     tag_index};
    return Result::Ok;
  }